

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall
Json::StyledStreamWriter::writeCommentBeforeValue(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  string local_60;
  string local_40;
  
  bVar2 = Value::hasComment(root,commentBefore);
  if (bVar2) {
    poVar1 = this->document_;
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    normalizeEOL(&local_60,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->document_,"\n",1);
  }
  return;
}

Assistant:

void StyledStreamWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;
  *document_ << normalizeEOL(root.getComment(commentBefore));
  *document_ << "\n";
}